

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

WildcardDimensionSpecifierSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::WildcardDimensionSpecifierSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Info *pIVar1;
  TokenKind TVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  WildcardDimensionSpecifierSyntax *pWVar6;
  
  pWVar6 = (WildcardDimensionSpecifierSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((WildcardDimensionSpecifierSyntax *)this->endPtr < pWVar6 + 1) {
    pWVar6 = (WildcardDimensionSpecifierSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pWVar6 + 1);
  }
  TVar2 = args->kind;
  uVar3 = args->field_0x2;
  NVar4.raw = (args->numFlags).raw;
  uVar5 = args->rawLen;
  pIVar1 = args->info;
  (pWVar6->super_DimensionSpecifierSyntax).super_SyntaxNode.kind = WildcardDimensionSpecifier;
  (pWVar6->super_DimensionSpecifierSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pWVar6->super_DimensionSpecifierSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pWVar6->star).kind = TVar2;
  (pWVar6->star).field_0x2 = uVar3;
  (pWVar6->star).numFlags = (NumericTokenFlags)NVar4.raw;
  (pWVar6->star).rawLen = uVar5;
  (pWVar6->star).info = pIVar1;
  return pWVar6;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }